

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_outfit(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  short sVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  CClass *pCVar7;
  OBJ_DATA *pOVar8;
  OBJ_INDEX_DATA *pOVar9;
  char *txt;
  ulong uVar10;
  long lVar11;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  iVar5 = skill_lookup("outfit");
  bVar4 = is_affected(ch,iVar5);
  if (bVar4) {
    txt = "You have outfitted too recently and cannot do so again.\n\r";
  }
  else {
    if ((ch->level < 0x1a) || (bVar4 = is_immortal(ch), bVar4)) {
      pPVar3 = ch->pcdata;
      pPVar3->condition[2] = 1;
      pPVar3->condition[3] = 1;
      pCVar7 = ch->my_class;
      if ((pCVar7 == (CClass *)0x0) &&
         ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
        pCVar7 = CClass::GetClass(0);
      }
      iVar5 = CClass::GetIndex(pCVar7);
      if (iVar5 != 0xb) {
        pCVar7 = ch->my_class;
        if ((pCVar7 == (CClass *)0x0) &&
           ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
            (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
          pCVar7 = CClass::GetClass(0);
        }
        CClass::GetIndex(pCVar7);
      }
      pOVar8 = get_eq_char(ch,5);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,7);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,8);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,9);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,10);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,0x10);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        if ((weapon_table.super__Vector_base<weapon_type,_std::allocator<weapon_type>_>._M_impl.
             super__Vector_impl_data._M_start)->name != (char *)0x0) {
          lVar11 = 0;
          uVar10 = 0;
          iVar5 = 0;
          do {
            pCVar7 = ch->my_class;
            if ((pCVar7 == (CClass *)0x0) &&
               ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
              pCVar7 = CClass::GetClass(0);
            }
            iVar6 = CClass::GetIndex(pCVar7);
            if (((iVar6 != 1) || (uVar10 != (uint)(int)ch->pcdata->start_weapon)) &&
               (sVar2 = **(short **)
                          ((long)&(weapon_table.
                                   super__Vector_base<weapon_type,_std::allocator<weapon_type>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->gsn + lVar11),
               ch->pcdata->learned[iVar5] < ch->pcdata->learned[sVar2])) {
              iVar5 = (int)sVar2;
            }
            uVar10 = uVar10 + 1;
            plVar1 = (long *)((long)&weapon_table.
                                     super__Vector_base<weapon_type,_std::allocator<weapon_type>_>.
                                     _M_impl.super__Vector_impl_data._M_start[1].name + lVar11);
            lVar11 = lVar11 + 0x18;
          } while (*plVar1 != 0);
        }
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar8 = get_eq_char(ch,0x10);
      if (((pOVar8 == (OBJ_DATA *)0x0) || (bVar4 = is_weapon_stat(pOVar8,5), !bVar4)) &&
         ((pOVar8 = get_eq_char(ch,0), pOVar8 == (OBJ_DATA *)0x0 &&
          (pOVar8 = get_eq_char(ch,0xb), pOVar8 == (OBJ_DATA *)0x0)))) {
        pOVar9 = get_obj_index(0);
        pOVar8 = create_object(pOVar9,0);
        pOVar8->cost = 0;
        obj_to_char(pOVar8,ch);
        wear_obj(ch,pOVar8,false);
      }
      pOVar9 = get_obj_index(0);
      pOVar8 = create_object(pOVar9,0);
      pOVar8->cost = 0;
      obj_to_char(pOVar8,ch);
      pOVar9 = get_obj_index(0);
      pOVar8 = create_object(pOVar9,0);
      pOVar8->cost = 0;
      obj_to_char(pOVar8,ch);
      pOVar9 = get_obj_index(0);
      pOVar8 = create_object(pOVar9,0);
      pOVar8->cost = 0;
      obj_to_char(pOVar8,ch);
      send_to_char("You have been equipped by the gods.\n\r",ch);
      init_affect(&AStack_98);
      AStack_98.where = 0;
      AStack_98.aftype = 2;
      iVar5 = skill_lookup("outfit");
      AStack_98.type = (short)iVar5;
      AStack_98.duration = 0x50;
      AStack_98.location = 0;
      AStack_98.bitvector[0]._3_1_ = AStack_98.bitvector[0]._3_1_ | 2;
      AStack_98.modifier = 0;
      AStack_98.level = ch->level;
      AStack_98.mod_name = 0x10;
      affect_to_char(ch,&AStack_98);
      return;
    }
    txt = "You are far too experienced to outfit yourself.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_outfit(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	int i, body, arms, legs, hands, feet, shield, sn, vnum;
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("outfit")))
	{
		send_to_char("You have outfitted too recently and cannot do so again.\n\r", ch);
		return;
	}

	if (ch->level > 25 && !is_immortal(ch))
	{
		send_to_char("You are far too experienced to outfit yourself.\n\r", ch);
		return;
	}

	ch->pcdata->condition[COND_THIRST] = 1;
	ch->pcdata->condition[COND_HUNGER] = 1;

	if (ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER)
	{
		body = 24570;
		arms = 24572;
		legs = 24574;
		hands = 24576;
		feet = 24578;
		shield = 24580;
	}
	else
	{
		body = 24571;
		arms = 24573;
		legs = 24575;
		hands = 24577;
		feet = 24579;
		shield = 24580;
	}

	obj = get_eq_char(ch, WEAR_BODY);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(body), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	/*
	obj = get_eq_char(ch, WEAR_HEAD);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3706), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_1);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_NECK_2);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3705), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	obj = get_eq_char(ch, WEAR_LEGS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(legs), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_FEET);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(feet), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_HANDS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(hands), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_ARMS);

	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(arms), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	obj = get_eq_char(ch, WEAR_ABOUT);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3711), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WAIST);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3712), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_L);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WRIST_R);
	if (obj == nullptr)
	{
		obj = create_object(get_obj_index(3713), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}
	*/

	/* do the weapon thing*/
	obj = get_eq_char(ch, WEAR_WIELD);

	if (obj == nullptr)
	{
		sn = 0;
		vnum = OBJ_VNUM_SCHOOL_SWORD;

		for (i = 0; weapon_table[i].name != nullptr; i++)
		{
			if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->pcdata->start_weapon == i)
			{
				vnum = weapon_table[i].vnum;
			}
			else if (ch->pcdata->learned[sn] < ch->pcdata->learned[*weapon_table[i].gsn])
			{
				sn = *weapon_table[i].gsn;
				vnum = weapon_table[i].vnum;
			}
		}

		obj = create_object(get_obj_index(vnum), 0);
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if ((obj == nullptr || !is_weapon_stat(obj, WEAPON_TWO_HANDS))
		&& (obj = get_eq_char(ch, WEAR_LIGHT)) == nullptr
		&& (obj = get_eq_char(ch, WEAR_SHIELD)) == nullptr)
	{
		obj = create_object(get_obj_index(OBJ_VNUM_SCHOOL_SHIELD), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
		wear_obj(ch, obj, false);
	}

	/*
	for(i=24580; i < 24590; i++)
	{
		obj = create_object(get_obj_index(i), 0);
		obj->cost = 0;
		obj_to_char(obj, ch);
	}
	*/

	obj = create_object(get_obj_index(311), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(2794), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	obj = create_object(get_obj_index(24534), 0);
	obj->cost = 0;
	obj_to_char(obj, ch);

	send_to_char("You have been equipped by the gods.\n\r", ch);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_POWER;
	af.type = skill_lookup("outfit");
	af.location = 0;
	af.duration = 80;

	SET_BIT(af.bitvector, AFF_DARK_VISION);

	af.modifier = 0;
	af.level = ch->level;
	af.mod_name = MOD_WARDROBE;
	affect_to_char(ch, &af);
}